

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O2

void __thiscall
cmCacheManager::CacheEntry::AppendProperty
          (CacheEntry *this,string *prop,string *value,bool asString)

{
  bool bVar1;
  CacheEntryType CVar2;
  allocator<char> local_41;
  string local_40;
  
  bVar1 = std::operator==(prop,"TYPE");
  if (bVar1) {
    if (value->_M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"STRING",&local_41);
    }
    else {
      std::__cxx11::string::string((string *)&local_40,(string *)value);
    }
    CVar2 = cmState::StringToCacheEntryType(&local_40);
    this->Type = CVar2;
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    bVar1 = std::operator==(prop,"VALUE");
    if (!bVar1) {
      cmPropertyMap::AppendProperty(&this->Properties,prop,value,asString);
      return;
    }
    if (value->_M_string_length != 0) {
      if ((this->Value)._M_string_length != 0 && !asString) {
        std::__cxx11::string::append((char *)this);
      }
      std::__cxx11::string::append((string *)this);
      return;
    }
  }
  return;
}

Assistant:

void cmCacheManager::CacheEntry::AppendProperty(const std::string& prop,
                                                const std::string& value,
                                                bool asString)
{
  if (prop == "TYPE") {
    this->Type =
      cmState::StringToCacheEntryType(!value.empty() ? value : "STRING");
  } else if (prop == "VALUE") {
    if (!value.empty()) {
      if (!this->Value.empty() && !asString) {
        this->Value += ";";
      }
      this->Value += value;
    }
  } else {
    this->Properties.AppendProperty(prop, value, asString);
  }
}